

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_make2DTree(HuffmanTree *tree)

{
  byte bVar1;
  uint *puVar2;
  uint local_28;
  uint uStack_24;
  uchar bit;
  uint i;
  uint n;
  uint treepos;
  uint nodefilled;
  HuffmanTree *tree_local;
  
  n = 0;
  i = 0;
  puVar2 = (uint *)lodepng_malloc((ulong)(tree->numcodes << 1) << 2);
  tree->tree2d = puVar2;
  if (tree->tree2d == (uint *)0x0) {
    tree_local._4_4_ = 0x53;
  }
  else {
    for (uStack_24 = 0; uStack_24 < tree->numcodes << 1; uStack_24 = uStack_24 + 1) {
      tree->tree2d[uStack_24] = 0x7fff;
    }
    for (uStack_24 = 0; uStack_24 < tree->numcodes; uStack_24 = uStack_24 + 1) {
      for (local_28 = 0; local_28 != tree->lengths[uStack_24]; local_28 = local_28 + 1) {
        bVar1 = (byte)(tree->tree1d[uStack_24] >>
                      (((char)tree->lengths[uStack_24] - (char)local_28) - 1U & 0x1f)) & 1;
        if ((0x7fffffff < i) || (tree->numcodes < i + 2)) {
          return 0x37;
        }
        if (tree->tree2d[i * 2 + (uint)bVar1] == 0x7fff) {
          if (local_28 + 1 == tree->lengths[uStack_24]) {
            tree->tree2d[i * 2 + (uint)bVar1] = uStack_24;
            i = 0;
          }
          else {
            n = n + 1;
            tree->tree2d[i * 2 + (uint)bVar1] = n + tree->numcodes;
            i = n;
          }
        }
        else {
          i = tree->tree2d[i * 2 + (uint)bVar1] - tree->numcodes;
        }
      }
    }
    for (uStack_24 = 0; uStack_24 < tree->numcodes << 1; uStack_24 = uStack_24 + 1) {
      if (tree->tree2d[uStack_24] == 0x7fff) {
        tree->tree2d[uStack_24] = 0;
      }
    }
    tree_local._4_4_ = 0;
  }
  return tree_local._4_4_;
}

Assistant:

static unsigned HuffmanTree_make2DTree(HuffmanTree* tree)
{
  unsigned nodefilled = 0; /*up to which node it is filled*/
  unsigned treepos = 0; /*position in the tree (1 of the numcodes columns)*/
  unsigned n, i;

  tree->tree2d = (unsigned*)lodepng_malloc(tree->numcodes * 2 * sizeof(unsigned));
  if(!tree->tree2d) return 83; /*alloc fail*/

  /*
  convert tree1d[] to tree2d[][]. In the 2D array, a value of 32767 means
  uninited, a value >= numcodes is an address to another bit, a value < numcodes
  is a code. The 2 rows are the 2 possible bit values (0 or 1), there are as
  many columns as codes - 1.
  A good huffman tree has N * 2 - 1 nodes, of which N - 1 are internal nodes.
  Here, the internal nodes are stored (what their 0 and 1 option point to).
  There is only memory for such good tree currently, if there are more nodes
  (due to too long length codes), error 55 will happen
  */
  for(n = 0; n < tree->numcodes * 2; ++n)
  {
    tree->tree2d[n] = 32767; /*32767 here means the tree2d isn't filled there yet*/
  }

  for(n = 0; n < tree->numcodes; ++n) /*the codes*/
  {
    for(i = 0; i != tree->lengths[n]; ++i) /*the bits for this code*/
    {
      unsigned char bit = (unsigned char)((tree->tree1d[n] >> (tree->lengths[n] - i - 1)) & 1);
      /*oversubscribed, see comment in lodepng_error_text*/
      if(treepos > 2147483647 || treepos + 2 > tree->numcodes) return 55;
      if(tree->tree2d[2 * treepos + bit] == 32767) /*not yet filled in*/
      {
        if(i + 1 == tree->lengths[n]) /*last bit*/
        {
          tree->tree2d[2 * treepos + bit] = n; /*put the current code in it*/
          treepos = 0;
        }
        else
        {
          /*put address of the next step in here, first that address has to be found of course
          (it's just nodefilled + 1)...*/
          ++nodefilled;
          /*addresses encoded with numcodes added to it*/
          tree->tree2d[2 * treepos + bit] = nodefilled + tree->numcodes;
          treepos = nodefilled;
        }
      }
      else treepos = tree->tree2d[2 * treepos + bit] - tree->numcodes;
    }
  }

  for(n = 0; n < tree->numcodes * 2; ++n)
  {
    if(tree->tree2d[n] == 32767) tree->tree2d[n] = 0; /*remove possible remaining 32767's*/
  }

  return 0;
}